

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

uint ON_RowReduce(uint row_count,uint col_count,double zero_pivot_tolerance,double **constA,
                 bool bInitializeB,bool bInitializeColumnPermutation,double **A,double **B,
                 uint *column_permutation,double *pivots)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  ON_Matrix *this;
  pointer pOVar6;
  double dVar7;
  uint local_cc;
  uint local_c8;
  uint rank;
  uint jj;
  uint ii;
  double xx;
  double x;
  double *s;
  double *r;
  double *c;
  unique_ptr<ON_Matrix,_std::default_delete<ON_Matrix>_> local_88;
  undefined4 local_7c;
  unique_ptr<ON_Matrix,_std::default_delete<ON_Matrix>_> local_78;
  unique_ptr<ON_Matrix,_std::default_delete<ON_Matrix>_> uA;
  double *b;
  double *a;
  uint j;
  uint i;
  double pivots_buffer [3];
  double **local_38;
  double **A_local;
  bool bInitializeColumnPermutation_local;
  bool bInitializeB_local;
  double **constA_local;
  double zero_pivot_tolerance_local;
  uint col_count_local;
  uint row_count_local;
  
  if (pivots == (double *)0x0) {
    pivots = (double *)&j;
  }
  pivots[1] = -1.0;
  *pivots = -1.0;
  pivots[2] = 0.0;
  if ((row_count == 0) || (row_count == 0xffffffff)) {
    return 0xffffffff;
  }
  if ((col_count == 0) || (col_count == 0xffffffff)) {
    return 0xffffffff;
  }
  if (B == (double **)0x0) {
    return 0xffffffff;
  }
  if (bInitializeB) {
    for (a._4_4_ = 0; a._4_4_ < row_count; a._4_4_ = a._4_4_ + 1) {
      uA._M_t.super___uniq_ptr_impl<ON_Matrix,_std::default_delete<ON_Matrix>_>._M_t.
      super__Tuple_impl<0UL,_ON_Matrix_*,_std::default_delete<ON_Matrix>_>.
      super__Head_base<0UL,_ON_Matrix_*,_false>._M_head_impl =
           *(__uniq_ptr_data<ON_Matrix,_std::default_delete<ON_Matrix>,_true,_true> *)
            &((__uniq_ptr_impl<ON_Matrix,_std::default_delete<ON_Matrix>_> *)(B + a._4_4_))->_M_t;
      for (a._0_4_ = 0; (uint)a < row_count; a._0_4_ = (uint)a + 1) {
        *(double *)
         ((long)uA._M_t.super___uniq_ptr_impl<ON_Matrix,_std::default_delete<ON_Matrix>_>._M_t.
                super__Tuple_impl<0UL,_ON_Matrix_*,_std::default_delete<ON_Matrix>_>.
                super__Head_base<0UL,_ON_Matrix_*,_false>._M_head_impl + (ulong)(uint)a * 8) = 0.0;
      }
      *(double *)
       ((long)uA._M_t.super___uniq_ptr_impl<ON_Matrix,_std::default_delete<ON_Matrix>_>._M_t.
              super__Tuple_impl<0UL,_ON_Matrix_*,_std::default_delete<ON_Matrix>_>.
              super__Head_base<0UL,_ON_Matrix_*,_false>._M_head_impl + (ulong)a._4_4_ * 8) = 1.0;
    }
  }
  if ((bInitializeColumnPermutation) && (column_permutation != (uint *)0x0)) {
    for (a._0_4_ = 0; (uint)a < row_count; a._0_4_ = (uint)a + 1) {
      column_permutation[(uint)a] = (uint)a;
    }
  }
  constA_local = (double **)zero_pivot_tolerance;
  if (zero_pivot_tolerance < 0.0) {
    constA_local = (double **)0x0;
  }
  std::unique_ptr<ON_Matrix,std::default_delete<ON_Matrix>>::
  unique_ptr<std::default_delete<ON_Matrix>,void>
            ((unique_ptr<ON_Matrix,std::default_delete<ON_Matrix>> *)&local_78);
  local_38 = A;
  if (A == (double **)0x0) {
    if (constA == (double **)0x0) {
      col_count_local = 0xffffffff;
      goto LAB_006fa298;
    }
    this = (ON_Matrix *)operator_new(0x48);
    ON_Matrix::ON_Matrix(this,row_count,col_count);
    std::unique_ptr<ON_Matrix,std::default_delete<ON_Matrix>>::
    unique_ptr<std::default_delete<ON_Matrix>,void>
              ((unique_ptr<ON_Matrix,std::default_delete<ON_Matrix>> *)&local_88,this);
    std::unique_ptr<ON_Matrix,_std::default_delete<ON_Matrix>_>::operator=(&local_78,&local_88);
    std::unique_ptr<ON_Matrix,_std::default_delete<ON_Matrix>_>::~unique_ptr(&local_88);
    pOVar6 = std::unique_ptr<ON_Matrix,_std::default_delete<ON_Matrix>_>::get(&local_78);
    local_38 = pOVar6->m;
  }
  if ((constA != (double **)0x0) && (local_38 != (double **)0x0)) {
    for (a._4_4_ = 0; a._4_4_ < row_count; a._4_4_ = a._4_4_ + 1) {
      pdVar3 = constA[a._4_4_];
      pdVar4 = local_38[a._4_4_];
      for (a._0_4_ = 0; (uint)a < row_count; a._0_4_ = (uint)a + 1) {
        pdVar4[(uint)a] = pdVar3[(uint)a];
      }
    }
  }
  for (local_cc = 0; local_cc < row_count; local_cc = local_cc + 1) {
    if (col_count <= local_cc) {
      col_count_local = local_cc;
      goto LAB_006fa298;
    }
    _jj = -1.0;
    local_c8 = local_cc;
    rank = local_cc;
    for (a._4_4_ = local_cc; a._4_4_ < row_count; a._4_4_ = a._4_4_ + 1) {
      for (a._0_4_ = local_cc; (uint)a < col_count; a._0_4_ = (uint)a + 1) {
        xx = ABS(local_38[a._4_4_][(uint)a]);
        if (_jj < xx) {
          rank = a._4_4_;
          local_c8 = (uint)a;
          _jj = xx;
        }
      }
    }
    if (_jj < 0.0) {
      col_count_local = 0xffffffff;
      goto LAB_006fa298;
    }
    if (*pivots <= 0.0 && *pivots != 0.0) {
      pivots[1] = _jj;
      *pivots = _jj;
    }
    if (_jj <= (double)constA_local) {
      pivots[2] = _jj;
      col_count_local = local_cc;
      goto LAB_006fa298;
    }
    if (_jj < *pivots || _jj == *pivots) {
      if (_jj < pivots[1]) {
        pivots[1] = _jj;
      }
    }
    else {
      *pivots = _jj;
    }
    pdVar3 = local_38[rank];
    uA._M_t.super___uniq_ptr_impl<ON_Matrix,_std::default_delete<ON_Matrix>_>._M_t.
    super__Tuple_impl<0UL,_ON_Matrix_*,_std::default_delete<ON_Matrix>_>.
    super__Head_base<0UL,_ON_Matrix_*,_false>._M_head_impl =
         *(__uniq_ptr_data<ON_Matrix,_std::default_delete<ON_Matrix>,_true,_true> *)
          &((tuple<ON_Matrix_*,_std::default_delete<ON_Matrix>_> *)(B + rank))->
           super__Tuple_impl<0UL,_ON_Matrix_*,_std::default_delete<ON_Matrix>_>;
    if (local_cc < rank) {
      local_38[rank] = local_38[local_cc];
      local_38[local_cc] = pdVar3;
      B[rank] = B[local_cc];
      ((__uniq_ptr_impl<ON_Matrix,_std::default_delete<ON_Matrix>_> *)(B + local_cc))->_M_t =
           (tuple<ON_Matrix_*,_std::default_delete<ON_Matrix>_>)
           uA._M_t.super___uniq_ptr_impl<ON_Matrix,_std::default_delete<ON_Matrix>_>._M_t.
           super__Tuple_impl<0UL,_ON_Matrix_*,_std::default_delete<ON_Matrix>_>.
           super__Head_base<0UL,_ON_Matrix_*,_false>._M_head_impl;
      if (column_permutation != (uint *)0x0) {
        uVar2 = column_permutation[rank];
        column_permutation[rank] = column_permutation[local_cc];
        column_permutation[local_cc] = uVar2;
      }
    }
    dVar1 = pdVar3[local_c8];
    pdVar3[local_c8] = pdVar3[local_cc];
    a._4_4_ = local_cc;
    while (a._4_4_ = a._4_4_ + 1, a._4_4_ < row_count) {
      pdVar4 = local_38[a._4_4_];
      dVar7 = pdVar4[local_c8] / -dVar1;
      pdVar4[local_c8] = pdVar4[local_cc];
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        pdVar5 = B[a._4_4_];
        for (a._0_4_ = 0; (uint)a <= local_cc; a._0_4_ = (uint)a + 1) {
          pdVar5[(uint)a] =
               dVar7 * *(double *)
                        ((long)uA._M_t.
                               super___uniq_ptr_impl<ON_Matrix,_std::default_delete<ON_Matrix>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_ON_Matrix_*,_std::default_delete<ON_Matrix>_>.
                               super__Head_base<0UL,_ON_Matrix_*,_false>._M_head_impl +
                        (ulong)(uint)a * 8) + pdVar5[(uint)a];
        }
        for (; (uint)a < col_count; a._0_4_ = (uint)a + 1) {
          pdVar5[(uint)a] =
               dVar7 * *(double *)
                        ((long)uA._M_t.
                               super___uniq_ptr_impl<ON_Matrix,_std::default_delete<ON_Matrix>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_ON_Matrix_*,_std::default_delete<ON_Matrix>_>.
                               super__Head_base<0UL,_ON_Matrix_*,_false>._M_head_impl +
                        (ulong)(uint)a * 8) + pdVar5[(uint)a];
          pdVar4[(uint)a] = dVar7 * pdVar3[(uint)a] + pdVar4[(uint)a];
        }
      }
    }
  }
  col_count_local = local_cc;
LAB_006fa298:
  local_7c = 1;
  std::unique_ptr<ON_Matrix,_std::default_delete<ON_Matrix>_>::~unique_ptr(&local_78);
  return col_count_local;
}

Assistant:

unsigned int ON_RowReduce(
  unsigned int row_count,
  unsigned int col_count,
  double zero_pivot_tolerance,
  const double*const* constA,
  bool bInitializeB,
  bool bInitializeColumnPermutation,
  double** A,
  double** B,
  unsigned int* column_permutation,
  double pivots[3]
  )
{
  double pivots_buffer[3];
  if (nullptr == pivots)
    pivots = pivots_buffer;
  pivots[0] = pivots[1] = -1.0;
  pivots[2] = 0.0;

  if (row_count < 1 || ON_UNSET_UINT_INDEX == row_count)
    return ON_UNSET_UINT_INDEX;

  if (col_count < 1 || ON_UNSET_UINT_INDEX == col_count)
    return ON_UNSET_UINT_INDEX;

  if (nullptr == B)
    return ON_UNSET_UINT_INDEX;

  unsigned int i, j;
  double* a;
  double* b;

  if (bInitializeB)
  {
    for (i = 0; i < row_count; i++)
    {
      b = B[i];
      for (j = 0; j < row_count; j++)
        b[j] = 0.0;
      b[i] = 1.0;
    }
  }

  if (bInitializeColumnPermutation && nullptr != column_permutation)
  {
    for (j = 0; j < row_count; j++)
      column_permutation[j] = j;
  }

  if (!(zero_pivot_tolerance >= 0.0))
    zero_pivot_tolerance = 0.0;

  std::unique_ptr< ON_Matrix > uA;
  if (nullptr == A)
  {
    if (nullptr == constA)
      return ON_UNSET_UINT_INDEX;
    uA = std::unique_ptr< ON_Matrix >(new ON_Matrix(row_count, col_count));
    A = uA.get()->m;
  }

  if (nullptr != constA && nullptr != A)
  {
    for (i = 0; i < row_count; i++)
    {
      const double* c = constA[i];
      a = A[i];
      for (j = 0; j < row_count; j++)
        a[j] = c[j];
    }
  }

  double* r;
  double* s;
  double x, xx;
  unsigned int ii, jj;
  ii = jj = 0;
  xx = fabs(A[ii][jj]);
  unsigned int rank;
  for (rank = 0; rank < row_count; rank++)
  {
    if (rank >= col_count)
      return rank;

    xx = -1.0;
    ii = jj = rank;
    for (i = rank; i < row_count; i++)
    {
      r = A[i];
      for (j = rank; j < col_count; j++)
      {
        x = fabs(r[j]);
        if (x > xx)
        {
          ii = i;
          jj = j;
          xx = x;
        }
      }
    }

    if (!(xx >= 0.0))
      return ON_UNSET_UINT_INDEX;

    if (pivots[0] < 0.0)
      pivots[0] = pivots[1] = xx;

    if (xx <= zero_pivot_tolerance)
    {
      pivots[2] = xx;
      return rank;
    }

    if (xx > pivots[0])
      pivots[0] = xx;
    else if (xx < pivots[1])
      pivots[1] = xx;


    a = A[ii];
    b = B[ii];
    if (ii > rank)
    {
      // swap rows M[ii] and M[rank] so maximum coefficient is in M[rank][jj]
      A[ii] = A[rank];
      A[rank] = a;
      B[ii] = B[rank];
      B[rank] = b;
      if (nullptr != column_permutation)
      {
        j = column_permutation[ii];
        column_permutation[ii] = column_permutation[rank];
        column_permutation[rank] = j;
      }
    }

    // swap columns M[jj] and M[rank] to maximum coefficient is in M[rank][rank]
    xx = -a[jj];
    a[jj] = a[rank];
    //a[rank] = -xx; // DEBUG

    for (i = rank + 1; i < row_count; i++)
    {
      // swap columns M[jj] and M[rank] 
      r = A[i];
      x = r[jj] / xx;
      //double dd = r[jj]; // DEBUG
      r[jj] = r[rank];
      //r[rank] = dd; // DEBUG

      // Use row operation
      // M[i] = M[i] - (row[i]/M[rank][rank])*M[rank]
      // to M[i][rank]
      if (0.0 != x)
      {
        s = B[i];
        for (j = 0; j <= rank; j++)
        {
          s[j] += x*b[j];
          //r[j] += x*a[j]; // DEBUG
        }
        for (/*empty init*/; j < col_count; j++)
        {
          s[j] += x*b[j];
          r[j] += x*a[j];
        }
      }
    }
  }
  return rank;
}